

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_cfg.cpp
# Opt level: O2

MPP_RET check_cfg_info(MppCfgInfo *node,char *name,CfgType type,char *func)

{
  int iVar1;
  MPP_RET MVar2;
  char *fmt;
  
  if (node == (MppCfgInfo *)0x0) {
    fmt = "%s: cfg %s is invalid\n";
  }
  else {
    if (type < CFG_FUNC_TYPE_BUTT) {
      iVar1 = node->data_size;
      switch(type) {
      default:
        if (iVar1 == 4) {
          return MPP_OK;
        }
        break;
      case CFG_FUNC_TYPE_S64:
      case CFG_FUNC_TYPE_U64:
        if (iVar1 == 8) {
          return MPP_OK;
        }
        break;
      case CFG_FUNC_TYPE_St:
        MVar2 = MPP_OK;
        if (node->data_type != CFG_FUNC_TYPE_St) {
          show_cfg_info_err(node,CFG_FUNC_TYPE_St,func,name);
          MVar2 = MPP_NOK;
        }
        if (0 < iVar1) {
          return MVar2;
        }
        fmt = "%s: cfg %s found invalid size %d\n";
        goto LAB_00139858;
      case CFG_FUNC_TYPE_Ptr:
        if (node->data_type == CFG_FUNC_TYPE_Ptr) {
          return MPP_OK;
        }
        type = CFG_FUNC_TYPE_Ptr;
      }
      show_cfg_info_err(node,type,func,name);
      return MPP_NOK;
    }
    fmt = "%s: cfg %s found invalid cfg type %d\n";
  }
LAB_00139858:
  _mpp_log_l(2,"mpp_cfg",fmt,(char *)0x0,func,name);
  return MPP_NOK;
}

Assistant:

MPP_RET check_cfg_info(MppCfgInfo *node, const char *name, CfgType type,
                       const char *func)
{
    if (NULL == node) {
        mpp_err("%s: cfg %s is invalid\n", func, name);
        return MPP_NOK;
    }

    CfgType cfg_type = (CfgType)node->data_type;
    RK_S32 cfg_size = node->data_size;
    MPP_RET ret = MPP_OK;

    switch (type) {
    case CFG_FUNC_TYPE_St : {
        if (cfg_type != type) {
            show_cfg_info_err(node, type, func, name);
            ret = MPP_NOK;
        }
        if (cfg_size <= 0) {
            mpp_err("%s: cfg %s found invalid size %d\n", func, name, cfg_size);
            ret = MPP_NOK;
        }
    } break;
    case CFG_FUNC_TYPE_Ptr : {
        if (cfg_type != type) {
            show_cfg_info_err(node, type, func, name);
            ret = MPP_NOK;
        }
    } break;
    case CFG_FUNC_TYPE_S32 :
    case CFG_FUNC_TYPE_U32 : {
        if (cfg_size != sizeof(RK_S32)) {
            show_cfg_info_err(node, type, func, name);
            ret = MPP_NOK;
        }
    } break;
    case CFG_FUNC_TYPE_S64 :
    case CFG_FUNC_TYPE_U64 : {
        if (cfg_size != sizeof(RK_S64)) {
            show_cfg_info_err(node, type, func, name);
            ret = MPP_NOK;
        }
    } break;
    default : {
        mpp_err("%s: cfg %s found invalid cfg type %d\n", func, name, type);
        ret = MPP_NOK;
    } break;
    }

    return ret;
}